

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

bool __thiscall
nuraft::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  buffer *this_00;
  element_type *peVar5;
  long *plVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  ReturnCode RVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  ptr<cluster_config> pVar16;
  ulong obj_id;
  string local_c0;
  ptr<snapshot> new_snp;
  ptr<cluster_config> c_conf;
  thread local_78;
  undefined1 local_70 [8];
  function<void_()> local_68;
  Param local_48;
  
  uVar1 = req->offset_;
  bVar8 = req->done_;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((uVar1 != 0 & (bVar8 ^ 1U)) == 0) {
    if (peVar2 != (element_type *)0x0) {
      iVar9 = (*peVar2->_vptr_logger[7])();
      if (3 < iVar9) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pcVar14 = "first obj";
        if (uVar1 != 0) {
          pcVar14 = "";
        }
        pcVar13 = "last obj";
        if (bVar8 == false) {
          pcVar13 = "";
        }
        msg_if_given_abi_cxx11_
                  ((string *)&obj_id,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
                   peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,pcVar14,pcVar13);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1d8,&obj_id);
LAB_0013b3b7:
        std::__cxx11::string::~string((string *)&obj_id);
      }
    }
  }
  else if (peVar2 != (element_type *)0x0) {
    iVar9 = (*peVar2->_vptr_logger[7])();
    if (4 < iVar9) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&obj_id,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
                 peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,"","");
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x1e1,&obj_id);
      goto LAB_0013b3b7;
    }
  }
  local_48.myId = this->id_;
  local_48.leaderId = (this->leader_).super___atomic_base<int>._M_i;
  local_48.peerId = -1;
  local_48.ctx = req;
  RVar10 = cb_func::call(&((this->ctx_)._M_t.
                           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                           .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                         SaveSnapshot,&local_48);
  if (RVar10 == ReturnNull) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar9 = (*peVar2->_vptr_logger[7])();
      if (2 < iVar9) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)&obj_id,"by callback, return false");
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1e8,&obj_id);
        std::__cxx11::string::~string((string *)&obj_id);
      }
    }
LAB_0013b917:
    bVar8 = false;
  }
  else {
    LOCK();
    (this->receiving_snapshot_)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if (((this->initialized_)._M_base._M_i & 1U) == 0) {
      LOCK();
      (this->initialized_)._M_base._M_i = true;
      UNLOCK();
    }
    peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->type_ == raw_binary) {
      peVar4 = (this->state_machine_).
               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar4->_vptr_state_machine[10])
                (peVar4,peVar3,req->offset_,
                 (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
    else {
      obj_id = req->offset_;
      this_00 = (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      buffer::pos(this_00,0);
      peVar4 = (this->state_machine_).
               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar4->_vptr_state_machine[0xb])
                (peVar4,(req->snapshot_).
                        super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &obj_id,this_00,(ulong)(uVar1 == 0),bVar8);
      req->offset_ = obj_id;
    }
    if (bVar8 != false) {
      pause_state_machine_exeuction(this,0);
      lVar15 = 0;
      while( true ) {
        bVar8 = wait_for_state_machine_pause(this,500);
        if (bVar8) break;
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar9 = (*peVar2->_vptr_logger[7])();
          if (3 < iVar9) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lVar15 = lVar15 + 1;
            msg_if_given_abi_cxx11_
                      ((string *)&obj_id,
                       "waiting for state machine pause before applying snapshot: count %zu",lVar15)
            ;
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x20f,(string *)&obj_id);
            std::__cxx11::string::~string((string *)&obj_id);
          }
        }
      }
      while (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        obj_id = 500;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&obj_id);
      }
      local_68.super__Function_base._M_functor._8_8_ = 0;
      local_68._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
           ::_M_invoke;
      local_68.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
           ::_M_manager;
      local_68.super__Function_base._M_functor._M_unused._M_object = this;
      std::function<void_()>::function((function<void_()> *)&obj_id,&local_68);
      std::_Function_base::~_Function_base(&local_68.super__Function_base);
      LOCK();
      (this->receiving_snapshot_)._M_base._M_i = false;
      UNLOCK();
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((this->role_)._M_i != follower) {
        if (peVar2 != (element_type *)0x0) {
          iVar9 = (*peVar2->_vptr_logger[7])();
          if (1 < iVar9) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_c0,"bad server role for applying a snapshot, exit for debugging");
            (*peVar2->_vptr_logger[8])
                      (peVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x220,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        plVar6 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar6 + 0x40))(plVar6,0xfffffffffffffff5);
LAB_0013badb:
        exit(-1);
      }
      if (peVar2 != (element_type *)0x0) {
        iVar9 = (*peVar2->_vptr_logger[7])();
        if (3 < iVar9) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_c0,"successfully receive a snapshot (idx %lu term %lu) from leader",
                     peVar3->last_log_idx_,peVar3->last_log_term_);
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_snapshot_sync_req",0x229,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      peVar5 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar9 = (*peVar5->_vptr_log_store[0xe])
                        (peVar5,((req->snapshot_).
                                 super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->last_log_idx_);
      if ((char)iVar9 == '\0') {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar11 = (*peVar2->_vptr_logger[7])();
          if (1 < iVar11) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_c0,
                       "failed to compact the log store after a snapshot is received, will ask the leader to retry"
                      );
            (*peVar2->_vptr_logger[8])
                      (peVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x25a,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
      }
      else {
        stop_election_timer(this);
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar11 = (*peVar2->_vptr_logger[7])();
          if (3 < iVar11) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_c0,
                       "successfully compact the log store, will now ask the statemachine to apply the snapshot"
                      );
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x231,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        peVar4 = (this->state_machine_).
                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar11 = (*peVar4->_vptr_state_machine[0xc])
                           (peVar4,(req->snapshot_).
                                   super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        if ((char)iVar11 == '\0') {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 != (element_type *)0x0) {
            iVar9 = (*peVar2->_vptr_logger[7])();
            if (1 < iVar9) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        (&local_c0,
                         "failed to apply the snapshot after log compacted, to ensure the safety, will shutdown the system"
                        );
              (*peVar2->_vptr_logger[8])
                        (peVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                         ,"handle_snapshot_sync_req",0x235,&local_c0);
              std::__cxx11::string::~string((string *)&local_c0);
            }
          }
          plVar6 = *(long **)&(((this->ctx_)._M_t.
                                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                              state_mgr_).
                              super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar6 + 0x40))(plVar6,0xfffffffffffffff4);
          goto LAB_0013badb;
        }
        reconfigure(this,&((req->snapshot_).
                           super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->last_config_);
        pVar16 = get_config((raft_server *)&c_conf);
        plVar6 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar6 + 0x18))
                  (plVar6,c_conf.
                          super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,
                   pVar16.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        LOCK();
        (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        LOCK();
        (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i =
             ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->last_log_idx_;
        UNLOCK();
        plVar6 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar6 + 0x20))
                  (plVar6,(this->state_).
                          super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_c0._M_dataplus._M_p = (pointer)peVar3->last_log_idx_;
        local_70 = (undefined1  [8])peVar3->last_log_term_;
        local_78._M_id._M_thread = (id)peVar3->size_;
        std::
        make_shared<nuraft::snapshot,unsigned_long,unsigned_long,std::shared_ptr<nuraft::cluster_config>&,unsigned_long,nuraft::snapshot::type>
                  ((unsigned_long *)&new_snp,(unsigned_long *)&local_c0,
                   (shared_ptr<nuraft::cluster_config> *)local_70,(unsigned_long *)&c_conf,
                   (type *)&local_78);
        set_last_snapshot(this,&new_snp);
        restart_election_timer(this);
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          iVar11 = (*peVar2->_vptr_logger[7])();
          if (3 < iVar11) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar1 = (new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->last_log_idx_;
            uVar7 = (new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->last_log_term_;
            iVar11 = (*((this->log_store_).
                        super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       _vptr_log_store[3])();
            iVar12 = (*((this->log_store_).
                        super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       _vptr_log_store[2])();
            msg_if_given_abi_cxx11_
                      (&local_c0,
                       "snapshot idx %lu term %lu is successfully applied, log start %lu last idx %lu"
                       ,uVar1,uVar7,CONCAT44(extraout_var,iVar11),
                       CONCAT44(extraout_var_00,iVar12) + -1);
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x256,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      handle_snapshot_sync_req::ExecAutoResume::~ExecAutoResume((ExecAutoResume *)&obj_id);
      if ((char)iVar9 == '\0') goto LAB_0013b917;
    }
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req) {
 try {
    // if offset == 0, it is the first object.
    bool is_first_obj = (req.get_offset()) ? false : true;
    bool is_last_obj = req.is_done();
    if (is_first_obj || is_last_obj) {
        // INFO level: log only first and last object.
        p_in("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    } else {
        // above DEBUG: log all.
        p_db("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    }

    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::SaveSnapshot, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return false");
        return false;
    }

    // Set flag to avoid initiating election by this node.
    receiving_snapshot_ = true;
    et_cnt_receiving_snapshot_ = 0;

    // Set initialized flag
    if (!initialized_) initialized_ = true;

    if (req.get_snapshot().get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary type (original).
        state_machine_->save_snapshot_data(req.get_snapshot(),
                                           req.get_offset(),
                                           req.get_data());
        // LCOV_EXCL_STOP

    } else {
        // Logical object type.
        ulong obj_id = req.get_offset();
        buffer& buf = req.get_data();
        buf.pos(0);
        state_machine_->save_logical_snp_obj(req.get_snapshot(),
                                             obj_id,
                                             buf,
                                             is_first_obj,
                                             is_last_obj);
        req.set_offset(obj_id);
    }

    if (is_last_obj) {
        // let's pause committing in backgroud so it doesn't access logs
        // while they are being compacted
        pause_state_machine_exeuction();
        size_t wait_count = 0;
        while (!wait_for_state_machine_pause(500)) {
            p_in("waiting for state machine pause before applying snapshot: count %zu",
                 ++wait_count);
        }
        while (sm_commit_exec_in_progress_)
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

        struct ExecAutoResume {
            explicit ExecAutoResume(std::function<void()> func) : clean_func_(func) {}
            ~ExecAutoResume() { clean_func_(); }
            std::function<void()> clean_func_;
        } exec_auto_resume([this](){ resume_state_machine_execution(); });


        receiving_snapshot_ = false;

        // Only follower will run this piece of code, but let's check it again
        if (role_ != srv_role::follower) {
            // LCOV_EXCL_START
            p_er("bad server role for applying a snapshot, exit for debugging");
            ctx_->state_mgr_->system_exit(raft_err::N11_not_follower_for_snapshot);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        p_in( "successfully receive a snapshot (idx %" PRIu64 " term %" PRIu64
              ") from leader",
              req.get_snapshot().get_last_log_idx(),
              req.get_snapshot().get_last_log_term() );
        if (log_store_->compact(req.get_snapshot().get_last_log_idx())) {
            // The state machine will not be able to commit anything before the
            // snapshot is applied, so make this synchronously with election
            // timer stopped as usually applying a snapshot may take a very
            // long time
            stop_election_timer();
            p_in("successfully compact the log store, will now ask the "
                 "statemachine to apply the snapshot");
            if (!state_machine_->apply_snapshot(req.get_snapshot())) {
                // LCOV_EXCL_START
                p_er("failed to apply the snapshot after log compacted, "
                     "to ensure the safety, will shutdown the system");
                ctx_->state_mgr_->system_exit(raft_err::N12_apply_snapshot_failed);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }

            reconfigure(req.get_snapshot().get_last_config());

            ptr<cluster_config> c_conf = get_config();
            ctx_->state_mgr_->save_config(*c_conf);

            precommit_index_ = req.get_snapshot().get_last_log_idx();
            sm_commit_index_ = req.get_snapshot().get_last_log_idx();
            quick_commit_index_ = req.get_snapshot().get_last_log_idx();
            lagging_sm_target_index_ = req.get_snapshot().get_last_log_idx();

            ctx_->state_mgr_->save_state(*state_);

            ptr<snapshot> new_snp = cs_new<snapshot>
                                    ( req.get_snapshot().get_last_log_idx(),
                                      req.get_snapshot().get_last_log_term(),
                                      c_conf,
                                      req.get_snapshot().size(),
                                      req.get_snapshot().get_type() );
            set_last_snapshot(new_snp);

            restart_election_timer();
            p_in("snapshot idx %" PRIu64 " term %" PRIu64 " is successfully applied, "
                 "log start %" PRIu64 " last idx %" PRIu64,
                 new_snp->get_last_log_idx(),
                 new_snp->get_last_log_term(),
                 log_store_->start_index(),
                 log_store_->next_slot() - 1);

        } else {
            p_er("failed to compact the log store after a snapshot is received, "
                 "will ask the leader to retry");
            return false;
        }
    }

 } catch (...) {
    // LCOV_EXCL_START
    p_er("failed to handle snapshot installation due to system errors");
    ctx_->state_mgr_->system_exit(raft_err::N13_snapshot_install_failed);
    ::exit(-1);
    return false;
    // LCOV_EXCL_STOP
 }

    return true;
}